

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void SplitPoly(FPolyNode *pnode,void *node,float *bbox)

{
  double *pdVar1;
  FPolyVertex *pFVar2;
  double *pdVar3;
  int iVar4;
  FPolySeg *pFVar5;
  FPolySeg *pFVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  long lVar13;
  FPolyNode *pFVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  void *node_00;
  ulong uVar20;
  float *bbox_00;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  double dVar26;
  float fVar27;
  double dVar28;
  double dVar29;
  float fVar30;
  float fVar31;
  double dVar32;
  float fVar33;
  float fVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  if (SplitPoly(FPolyNode*,void*,float*)::lists == '\0') {
    SplitPoly();
  }
  if (((ulong)node & 1) != 0) {
    pFVar14 = *(FPolyNode **)((long)node + 7);
    pnode->pnext = pFVar14;
    if (pFVar14 != (FPolyNode *)0x0) {
      if (pFVar14->state != 0x539) {
        __assert_fail("pnode->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x82a,"void SplitPoly(FPolyNode *, void *, float *)");
      }
      pFVar14->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    *(FPolyNode **)((long)node + 7) = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = (subsector_t *)((long)node + -1);
    uVar20 = (ulong)(pnode->segs).Count;
    if (uVar20 == 0) {
      __assert_fail("pnode->segs.Size() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x836,"void SplitPoly(FPolyNode *, void *, float *)");
    }
    pFVar6 = (pnode->segs).Array;
    fVar25 = 1.1754944e-38;
    fVar27 = 3.4028235e+38;
    fVar34 = 3.4028235e+38;
    fVar31 = 1.1754944e-38;
    lVar12 = 0;
    do {
      pdVar1 = (double *)((long)&(pFVar6->v1).pos.X + lVar12);
      pdVar3 = (double *)((long)&(pFVar6->v2).pos.X + lVar12);
      fVar30 = (float)*pdVar1;
      fVar33 = (float)pdVar1[1];
      fVar25 = (float)(~-(uint)(fVar25 < fVar33) & (uint)fVar25 |
                      (uint)fVar33 & -(uint)(fVar25 < fVar33));
      fVar27 = (float)(~-(uint)(fVar30 < fVar27) & (uint)fVar27 |
                      (uint)fVar30 & -(uint)(fVar30 < fVar27));
      fVar33 = (float)(~-(uint)(fVar33 < fVar34) & (uint)fVar34 |
                      (uint)fVar33 & -(uint)(fVar33 < fVar34));
      fVar30 = (float)(~-(uint)(fVar31 < fVar30) & (uint)fVar31 |
                      (uint)fVar30 & -(uint)(fVar31 < fVar30));
      fVar31 = (float)*pdVar3;
      fVar34 = (float)pdVar3[1];
      uVar21 = -(uint)(fVar25 < fVar34);
      uVar24 = -(uint)(fVar30 < fVar31);
      uVar22 = -(uint)(fVar31 < fVar27);
      uVar23 = -(uint)(fVar34 < fVar33);
      fVar25 = (float)(~uVar21 & (uint)fVar25 | (uint)fVar34 & uVar21);
      fVar27 = (float)(~uVar22 & (uint)fVar27 | (uint)fVar31 & uVar22);
      fVar34 = (float)(~uVar23 & (uint)fVar33 | (uint)fVar34 & uVar23);
      fVar31 = (float)(~uVar24 & (uint)fVar30 | (uint)fVar31 & uVar24);
      lVar12 = lVar12 + 0x28;
    } while (uVar20 * 0x28 != lVar12);
    if (*bbox <= fVar25 && fVar25 != *bbox) {
      *bbox = fVar25;
    }
    if (fVar34 < bbox[1]) {
      bbox[1] = fVar34;
    }
    if (fVar27 < bbox[2]) {
      bbox[2] = fVar27;
    }
    if (bbox[3] <= fVar31 && fVar31 != bbox[3]) {
      bbox[3] = fVar31;
    }
    return;
  }
  if (SplitPoly::lists[0].Count != 0) {
    SplitPoly::lists[0].Count = 0;
  }
  if (SplitPoly::lists[1].Count != 0) {
    SplitPoly::lists[1].Count = 0;
  }
  if ((pnode->segs).Count == 0) {
LAB_004722f3:
    node_00 = *(void **)((long)node + 0x38);
    bbox_00 = (float *)((long)node + 0x10);
  }
  else {
    lVar12 = ((long)*node - (long)SUB84((pnode->poly->CenterSpot).pos.X + 103079215104.0,0)) *
             (long)*(int *)((long)node + 0xc) +
             ((long)SUB84((pnode->poly->CenterSpot).pos.Y + 103079215104.0,0) -
             (long)*(int *)((long)node + 4)) * (long)*(int *)((long)node + 8);
    lVar19 = 0;
    uVar20 = 0;
    do {
      pFVar5 = (pnode->segs).Array;
      pFVar6 = (FPolySeg *)((long)&(pFVar5->v1).pos.X + lVar19);
      iVar4 = *(int *)((long)node + 0xc);
      lVar13 = (long)iVar4;
      lVar17 = (long)*(int *)((long)node + 8);
      dVar32 = (double)*(float *)((long)node + 0x30);
      pdVar1 = (double *)((long)&(pFVar5->v1).pos.X + lVar19);
      dVar26 = *pdVar1;
      dVar29 = pdVar1[1];
      pdVar1 = (double *)((long)&(pFVar5->v2).pos.X + lVar19);
      dVar10 = *pdVar1;
      dVar11 = pdVar1[1];
      iVar15 = (int)*node;
      iVar9 = (int)((ulong)*node >> 0x20);
      dVar35 = (double)*(int *)((long)node + 8) * 1.52587890625e-05;
      dVar36 = (double)iVar15 * 1.52587890625e-05;
      dVar28 = (dVar29 - (double)iVar9 * 1.52587890625e-05) * dVar35;
      auVar37._0_8_ =
           ABS((dVar11 - (double)iVar9 * 1.52587890625e-05) * dVar35 +
               (dVar10 - dVar36) * (double)-iVar4 * 1.52587890625e-05);
      auVar37._8_8_ = ABS(dVar28 + (dVar26 - dVar36) * (double)-iVar4 * 1.52587890625e-05);
      auVar38._8_4_ = SUB84(dVar32,0);
      auVar38._0_8_ = dVar32;
      auVar38._12_4_ = (int)((ulong)dVar32 >> 0x20);
      auVar38 = divpd(auVar37,auVar38);
      if (auVar38._8_8_ <= 0.3125) {
        bVar7 = (int)((ulong)lVar12 >> 0x20) != 0 && -1 < lVar12;
        if (0.3125 < auVar38._0_8_) {
          iVar16 = (int)((ulong)((iVar15 - SUB84(dVar10 + 103079215104.0,0)) * lVar13 +
                                (SUB84(dVar11 + 103079215104.0,0) - iVar9) * lVar17) >> 0x20);
          goto LAB_0047209e;
        }
LAB_004720b6:
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + bVar7,pFVar6);
      }
      else {
        lVar18 = (iVar15 - SUB84(dVar26 + 103079215104.0,0)) * lVar13 +
                 (SUB84(dVar29 + 103079215104.0,0) - iVar9) * lVar17;
        iVar16 = (int)((ulong)lVar18 >> 0x20);
        if (auVar38._0_8_ <= 0.3125) {
LAB_0047209e:
          bVar7 = 0 < iVar16;
          goto LAB_004720b6;
        }
        lVar13 = (iVar15 - SUB84(dVar10 + 103079215104.0,0)) * lVar13 +
                 (SUB84(dVar11 + 103079215104.0,0) - iVar9) * lVar17;
        iVar15 = (int)((ulong)lVar13 >> 0x20);
        if ((iVar16 != 0 && -1 < lVar18) == (iVar15 != 0 && -1 < lVar13)) goto LAB_0047209e;
        dVar32 = (double)iVar4 * 1.52587890625e-05 * (dVar10 - dVar26) - dVar35 * (dVar11 - dVar29);
        if ((((dVar32 == 0.0) && (!NAN(dVar32))) ||
            (dVar32 = (dVar28 + (double)iVar4 * 1.52587890625e-05 * (dVar36 - dVar26)) / dVar32,
            dVar32 < 0.0)) || (1.0 < dVar32)) goto LAB_0047209e;
        bVar7 = iVar15 != 0 && -1 < lVar13;
        bVar8 = iVar16 != 0 && -1 < lVar18;
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists,pFVar6);
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + 1,pFVar6);
        dVar26 = dVar26 + (dVar10 - dVar26) * dVar32;
        dVar29 = dVar29 + (dVar11 - dVar29) * dVar32;
        pFVar2 = &SplitPoly::lists[bVar8].Array[SplitPoly::lists[bVar8].Count - 1].v2;
        (pFVar2->pos).X = dVar26;
        (pFVar2->pos).Y = dVar29;
        pFVar6 = SplitPoly::lists[bVar7].Array;
        uVar21 = SplitPoly::lists[bVar7].Count;
        pFVar6[uVar21 - 1].v1.pos.X = dVar26;
        pFVar6[uVar21 - 1].v1.pos.Y = dVar29;
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x28;
    } while (uVar20 < (pnode->segs).Count);
    if (SplitPoly::lists[1].Count == 0) goto LAB_004722f3;
    if (SplitPoly::lists[0].Count != 0) {
      if (FreePolyNodes == (FPolyNode *)0x0) {
        pFVar14 = (FPolyNode *)operator_new(0x40);
        (pFVar14->segs).Array = (FPolySeg *)0x0;
        (pFVar14->segs).Most = 0;
        (pFVar14->segs).Count = 0;
      }
      else {
        pFVar14 = FreePolyNodes;
        FreePolyNodes = FreePolyNodes->pnext;
      }
      pFVar14->state = 0x539;
      pFVar14->poly = (FPolyObj *)0x0;
      pFVar14->pnext = (FPolyNode *)0x0;
      pFVar14->pprev = (FPolyNode *)0x0;
      pFVar14->subsector = (subsector_t *)0x0;
      pFVar14->snext = (FPolyNode *)0x0;
      pFVar14->poly = pnode->poly;
      TArray<FPolySeg,_FPolySeg>::operator=(&pFVar14->segs,SplitPoly::lists + 1);
      TArray<FPolySeg,_FPolySeg>::operator=(&pnode->segs,SplitPoly::lists);
      bbox_00 = (float *)((long)node + 0x20);
      SplitPoly(pFVar14,*(void **)((long)node + 0x40),bbox_00);
      SplitPoly(pnode,*(void **)((long)node + 0x38),(float *)((long)node + 0x10));
      AddToBBox((float *)((long)node + 0x10),bbox);
      goto LAB_004723a3;
    }
    node_00 = *(void **)((long)node + 0x40);
    bbox_00 = (float *)((long)node + 0x20);
  }
  SplitPoly(pnode,node_00,bbox_00);
LAB_004723a3:
  AddToBBox(bbox_00,bbox);
  return;
}

Assistant:

static void SplitPoly(FPolyNode *pnode, void *node, float bbox[4])
{
	static TArray<FPolySeg> lists[2];
	static const double POLY_EPSILON = 0.3125;

	if (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		int centerside = R_PointOnSide(pnode->poly->CenterSpot.pos, bsp);

		lists[0].Clear();
		lists[1].Clear();
		for(unsigned i=0;i<pnode->segs.Size(); i++)
		{
			FPolySeg *seg = &pnode->segs[i];

			// Parts of the following code were taken from Eternity and are
			// being used with permission.

			// get distance of vertices from partition line
			// If the distance is too small, we may decide to
			// change our idea of sidedness.
			double dist_v1 = PartitionDistance(&seg->v1, bsp);
			double dist_v2 = PartitionDistance(&seg->v2, bsp);

			// If the distances are less than epsilon, consider the points as being
			// on the same side as the polyobj origin. Why? People like to build
			// polyobject doors flush with their door tracks. This breaks using the
			// usual assumptions.
			

			// Addition to Eternity code: We must also check any seg with only one
			// vertex inside the epsilon threshold. If not, these lines will get split but
			// adjoining ones with both vertices inside the threshold won't thus messing up
			// the order in which they get drawn.

			if(dist_v1 <= POLY_EPSILON)
			{
				if (dist_v2 <= POLY_EPSILON)
				{
					lists[centerside].Push(*seg);
				}
				else
				{
					int side = R_PointOnSide(seg->v2.pos, bsp);
					lists[side].Push(*seg);
				}
			}
			else if (dist_v2 <= POLY_EPSILON)
			{
				int side = R_PointOnSide(seg->v1.pos, bsp);
				lists[side].Push(*seg);
			}
			else 
			{
				int side1 = R_PointOnSide(seg->v1.pos, bsp);
				int side2 = R_PointOnSide(seg->v2.pos, bsp);

				if(side1 != side2)
				{
					// if the partition line crosses this seg, we must split it.

					FPolyVertex vert;

					if (GetIntersection(seg, bsp, &vert))
					{
						lists[0].Push(*seg);
						lists[1].Push(*seg);
						lists[side1].Last().v2 = vert;
						lists[side2].Last().v1 = vert;
					}
					else
					{
						// should never happen
						lists[side1].Push(*seg);
					}
				}
				else 
				{
					// both points on the same side.
					lists[side1].Push(*seg);
				}
			}
		}
		if (lists[1].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);
			AddToBBox(bsp->bbox[0], bbox);
		}
		else if (lists[0].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[1], bsp->bbox[1]);
			AddToBBox(bsp->bbox[1], bbox);
		}
		else
		{
			// create the new node 
			FPolyNode *newnode = NewPolyNode();
			newnode->poly = pnode->poly;
			newnode->segs = lists[1];

			// set segs for original node
			pnode->segs = lists[0];
		
			// recurse back side
			SplitPoly(newnode, bsp->children[1], bsp->bbox[1]);
			
			// recurse front side
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);

			AddToBBox(bsp->bbox[0], bbox);
			AddToBBox(bsp->bbox[1], bbox);
		}
	}
	else
	{
		// we reached a subsector so we can link the node with this subsector
		subsector_t *sub = (subsector_t *)((BYTE *)node - 1);

		// Link node to subsector
		pnode->pnext = sub->polys;
		if (pnode->pnext != NULL) 
		{
			assert(pnode->pnext->state == 1337);
			pnode->pnext->pprev = pnode;
		}
		pnode->pprev = NULL;
		sub->polys = pnode;

		// link node to polyobject
		pnode->snext = pnode->poly->subsectorlinks;
		pnode->poly->subsectorlinks = pnode;
		pnode->subsector = sub;

		// calculate bounding box for this polynode
		assert(pnode->segs.Size() != 0);
		float subbbox[4] = { FLT_MIN, FLT_MAX, FLT_MAX, FLT_MIN };

		for (unsigned i = 0; i < pnode->segs.Size(); ++i)
		{
			AddToBBox(&pnode->segs[i].v1, subbbox);
			AddToBBox(&pnode->segs[i].v2, subbbox);
		}
		// Potentially expand the parent node's bounding box to contain these bits of polyobject.
		AddToBBox(subbbox, bbox);
	}
}